

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskDataset.cpp
# Opt level: O0

void __thiscall
OnDiskDataset::execute(OnDiskDataset *this,Query *query,ResultWriter *out,QueryCounters *counters)

{
  string_view_t fmt;
  bool bVar1;
  reference this_00;
  OnDiskDataset *this_01;
  Query *in_RDX;
  OnDiskDataset *in_RDI;
  uint *fid;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  QueryResult result;
  Query plan;
  OnDiskIndex *ndx;
  const_iterator __end1;
  const_iterator __begin1;
  vector<OnDiskIndex,_std::allocator<OnDiskIndex>_> *__range1;
  unordered_set<IndexType,_std::hash<IndexType>,_std::equal_to<IndexType>,_std::allocator<IndexType>_>
  types_to_query;
  Query *in_stack_fffffffffffffdb8;
  Query *in_stack_fffffffffffffdc0;
  anon_class_8_1_ba1d6aae *in_stack_fffffffffffffdc8;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_fffffffffffffdd0;
  string local_1e0 [32];
  reference local_1c0;
  uint *local_1b8;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_1b0;
  OnDiskDataset *local_1a8;
  unordered_set<IndexType,_std::hash<IndexType>,_std::equal_to<IndexType>,_std::allocator<IndexType>_>
  *in_stack_fffffffffffffe60;
  Query *in_stack_fffffffffffffe68;
  QueryCounters *in_stack_fffffffffffffe88;
  Query *in_stack_fffffffffffffe90;
  OnDiskDataset *in_stack_fffffffffffffe98;
  __normal_iterator<const_OnDiskIndex_*,_std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>_>
  local_78 [3];
  vector<OnDiskIndex,_std::allocator<OnDiskIndex>_> *local_60;
  Query *in_stack_ffffffffffffffc8;
  
  std::
  unordered_set<IndexType,_std::hash<IndexType>,_std::equal_to<IndexType>,_std::allocator<IndexType>_>
  ::unordered_set((unordered_set<IndexType,_std::hash<IndexType>,_std::equal_to<IndexType>,_std::allocator<IndexType>_>
                   *)0x1a2eb1);
  local_60 = get_indexes(in_RDI);
  local_78[0]._M_current =
       (OnDiskIndex *)
       std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>::begin
                 ((vector<OnDiskIndex,_std::allocator<OnDiskIndex>_> *)in_stack_fffffffffffffdb8);
  std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>::end
            ((vector<OnDiskIndex,_std::allocator<OnDiskIndex>_> *)in_stack_fffffffffffffdb8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_OnDiskIndex_*,_std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>_>
                             *)in_stack_fffffffffffffdc0,
                            (__normal_iterator<const_OnDiskIndex_*,_std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>_>
                             *)in_stack_fffffffffffffdb8), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_OnDiskIndex_*,_std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>_>
              ::operator*(local_78);
    OnDiskIndex::index_type(this_00);
    std::
    unordered_set<IndexType,_std::hash<IndexType>,_std::equal_to<IndexType>,_std::allocator<IndexType>_>
    ::emplace<IndexType>
              ((unordered_set<IndexType,_std::hash<IndexType>,_std::equal_to<IndexType>,_std::allocator<IndexType>_>
                *)in_stack_fffffffffffffdd0,(IndexType *)in_stack_fffffffffffffdc8);
    __gnu_cxx::
    __normal_iterator<const_OnDiskIndex_*,_std::vector<OnDiskIndex,_std::allocator<OnDiskIndex>_>_>
    ::operator++(local_78);
  }
  Query::plan(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  q_optimize(in_stack_ffffffffffffffc8);
  Query::operator=(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  Query::~Query(in_stack_fffffffffffffdc0);
  ::fmt::v6::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8)
  ;
  fmt.size_ = (size_t)in_stack_fffffffffffffdd0;
  fmt.data_ = (char *)in_stack_fffffffffffffdc8;
  spdlog::debug<Query>(fmt,in_stack_fffffffffffffdc0);
  OnDiskDataset::query
            (in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  bVar1 = QueryResult::is_everything((QueryResult *)&stack0xfffffffffffffe88);
  if (bVar1) {
    std::optional<OnDiskFileIndex>::operator->((optional<OnDiskFileIndex> *)0x1a308e);
    std::function<void(std::__cxx11::string_const&)>::
    function<OnDiskDataset::execute(Query_const&,ResultWriter*,QueryCounters*)const::__0,void>
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    OnDiskFileIndex::for_each_filename
              ((OnDiskFileIndex *)__end2._M_current,
               (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)fid);
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 *)0x1a30db);
  }
  else {
    QueryResult::vector((QueryResult *)&stack0xfffffffffffffe88);
    this_01 = (OnDiskDataset *)SortedRun::decompressed((SortedRun *)in_stack_fffffffffffffdc0);
    local_1a8 = this_01;
    local_1b0._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            in_stack_fffffffffffffdb8);
    local_1b8 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   in_stack_fffffffffffffdb8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)in_stack_fffffffffffffdc0,
                              (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)in_stack_fffffffffffffdb8), bVar1) {
      local_1c0 = __gnu_cxx::
                  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator*(&local_1b0);
      in_stack_fffffffffffffdc0 = in_RDX;
      get_file_name_abi_cxx11_(this_01,(FileId)((ulong)in_RDX >> 0x20));
      (**(code **)(*(long *)in_stack_fffffffffffffdc0 + 0x10))(in_stack_fffffffffffffdc0,local_1e0);
      std::__cxx11::string::~string(local_1e0);
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&local_1b0);
    }
  }
  QueryResult::~QueryResult((QueryResult *)0x1a324f);
  Query::~Query(in_stack_fffffffffffffdc0);
  std::
  unordered_set<IndexType,_std::hash<IndexType>,_std::equal_to<IndexType>,_std::allocator<IndexType>_>
  ::~unordered_set((unordered_set<IndexType,_std::hash<IndexType>,_std::equal_to<IndexType>,_std::allocator<IndexType>_>
                    *)0x1a3269);
  return;
}

Assistant:

void OnDiskDataset::execute(const Query &query, ResultWriter *out,
                            QueryCounters *counters) const {
    std::unordered_set<IndexType> types_to_query;
    for (const auto &ndx : get_indexes()) {
        types_to_query.emplace(ndx.index_type());
    }
    Query plan = query.plan(types_to_query);
    plan = q_optimize(std::move(plan));
    spdlog::debug("PLAN: {}", plan);

    QueryResult result = this->query(plan, counters);
    if (result.is_everything()) {
        files_index->for_each_filename(
            [&out](const std::string &fname) { out->push_back(fname); });
    } else {
        for (const auto &fid : result.vector().decompressed()) {
            out->push_back(get_file_name(fid));
        }
    }
}